

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailureTest.cpp
# Opt level: O0

Utest * __thiscall
TEST_TestFailure_StringsEqualFailureWithText_TestShell::createTest
          (TEST_TestFailure_StringsEqualFailureWithText_TestShell *this)

{
  TEST_TestFailure_StringsEqualFailureWithText_Test *this_00;
  TEST_TestFailure_StringsEqualFailureWithText_TestShell *this_local;
  
  this_00 = (TEST_TestFailure_StringsEqualFailureWithText_Test *)
            operator_new(0x10,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestFailureTest.cpp"
                         ,0xac);
  TEST_TestFailure_StringsEqualFailureWithText_Test::
  TEST_TestFailure_StringsEqualFailureWithText_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(TestFailure, StringsEqualFailureWithText)
{
    StringEqualFailure f(test, failFileName, failLineNumber, "abc", "abd", "text");
    FAILURE_EQUAL("Message: text\n"
                  "\texpected <abc>\n"
                  "\tbut was  <abd>\n"
                  "\tdifference starts at position 2 at: <        abd         >\n"
                  "\t                                               ^", f);
}